

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O2

void __thiscall
OpenMD::SpatialStatistics::SpatialStatistics
          (SpatialStatistics *this,SimInfo *info,string *filename,string *sele,int nbins)

{
  SelectionEvaluator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__SpatialStatistics_002ee728
  ;
  this->currentSnapshot_ = (Snapshot *)0x0;
  this->nProcessed_ = 0;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan_,info);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_70,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_70);
  }
  getPrefix(&local_50,filename);
  std::operator+(&local_70,&local_50,".spst");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

SpatialStatistics::SpatialStatistics(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& sele, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    setOutputName(getPrefix(filename) + ".spst");
  }